

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O0

void duckdb::AggregateExecutor::Combine<duckdb::BitState<unsigned_short>,duckdb::BitOrOperation>
               (Vector *source,Vector *target,AggregateInputData *aggr_input_data,idx_t count)

{
  BitState<unsigned_short> *source_00;
  BitState<unsigned_short> *in_RCX;
  idx_t i;
  BitState<unsigned_short> **tdata;
  BitState<unsigned_short> **sdata;
  BitState<unsigned_short> *target_00;
  
  FlatVector::GetData<duckdb::BitState<unsigned_short>const*>((Vector *)0x97e242);
  source_00 = (BitState<unsigned_short> *)
              FlatVector::GetData<duckdb::BitState<unsigned_short>*>((Vector *)0x97e251);
  for (target_00 = (BitState<unsigned_short> *)0x0; target_00 < in_RCX;
      target_00 = (BitState<unsigned_short> *)&target_00->field_0x1) {
    BitwiseOperation::Combine<duckdb::BitState<unsigned_short>,duckdb::BitOrOperation>
              (source_00,target_00,(AggregateInputData *)0x97e28d);
  }
  return;
}

Assistant:

static void Combine(Vector &source, Vector &target, AggregateInputData &aggr_input_data, idx_t count) {
		D_ASSERT(source.GetType().id() == LogicalTypeId::POINTER && target.GetType().id() == LogicalTypeId::POINTER);
		auto sdata = FlatVector::GetData<const STATE_TYPE *>(source);
		auto tdata = FlatVector::GetData<STATE_TYPE *>(target);

		for (idx_t i = 0; i < count; i++) {
			OP::template Combine<STATE_TYPE, OP>(*sdata[i], *tdata[i], aggr_input_data);
		}
	}